

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.cc
# Opt level: O3

int __thiscall FileInfo::Update(FileInfo *this,ByteBuffer *buffer)

{
  int iVar1;
  unsigned_long_long uVar2;
  
  uVar2 = crail::ByteBuffer::GetLong(buffer);
  this->fd_ = uVar2;
  uVar2 = crail::ByteBuffer::GetLong(buffer);
  this->capacity_ = uVar2;
  iVar1 = crail::ByteBuffer::GetInt(buffer);
  this->node_type_ = iVar1;
  uVar2 = crail::ByteBuffer::GetLong(buffer);
  this->dir_offset_ = uVar2;
  uVar2 = crail::ByteBuffer::GetLong(buffer);
  this->token_ = uVar2;
  uVar2 = crail::ByteBuffer::GetLong(buffer);
  this->modification_time_ = uVar2;
  return 0;
}

Assistant:

int FileInfo::Update(ByteBuffer &buffer) {
  fd_ = buffer.GetLong();
  capacity_ = buffer.GetLong();
  node_type_ = buffer.GetInt();
  dir_offset_ = buffer.GetLong();
  token_ = buffer.GetLong();
  modification_time_ = buffer.GetLong();

  return 0;
}